

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

void __thiscall
llvm::Expected<llvm::DWARFDebugRnglistTable>::~Expected
          (Expected<llvm::DWARFDebugRnglistTable> *this)

{
  void *pvVar1;
  pointer *__ptr;
  
  if ((this->field_0x98 & 1) == 0) {
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                 *)((long)&this->field_0 + 0x58));
    pvVar1 = *(void **)((long)&this->field_0 + 0x10);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&this->field_0 + 0x20) - (long)pvVar1);
      return;
    }
  }
  else {
    if (*(long **)&this->field_0 != (long *)0x0) {
      (**(code **)(**(long **)&this->field_0 + 8))();
    }
    *(undefined8 *)(this->field_0).ErrorStorage.buffer = 0;
  }
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }